

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *in,QBitArray *ba)

{
  qsizetype qVar1;
  quint8 *c;
  undefined1 *puVar2;
  qint64 qVar3;
  char *pcVar4;
  Data *pDVar5;
  char cVar6;
  Status status;
  long lVar7;
  long len;
  long in_FS_OFFSET;
  quint32 tmp;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::clear(&ba->d);
  if (in->ver < 0x14) {
    local_40 = (undefined1 *)CONCAT44(local_40._4_4_,0xaaaaaaaa);
    QDataStream::operator>>(in,(qint32 *)&local_40);
    puVar2 = (undefined1 *)(long)(int)local_40;
    if ((long)(int)local_40 < 0) {
LAB_00353ead:
      status = ReadCorruptData;
    }
    else {
LAB_00353d40:
      if (puVar2 == (undefined1 *)0x0) {
        QByteArray::clear(&ba->d);
        goto LAB_00353eba;
      }
      lVar7 = 0;
      do {
        len = ((ulong)(puVar2 + 7) >> 3) - lVar7;
        if (len == 0 || (long)((ulong)(puVar2 + 7) >> 3) < lVar7) {
          pDVar5 = (ba->d).d.d;
          qVar1 = (ba->d).d.size;
          if ((pDVar5 == (Data *)0x0) ||
             (1 < (__int_type_conflict)
                  (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
            QByteArray::reallocData(&ba->d,qVar1,KeepSize);
            pDVar5 = (ba->d).d.d;
            pcVar4 = (ba->d).d.ptr;
            cVar6 = pcVar4[qVar1 + -1];
            if (pDVar5 != (Data *)0x0) goto LAB_00353e2f;
LAB_00353e36:
            QByteArray::reallocData(&ba->d,(ba->d).d.size,KeepSize);
            pcVar4 = (ba->d).d.ptr;
          }
          else {
            pcVar4 = (ba->d).d.ptr;
            cVar6 = pcVar4[qVar1 + -1];
LAB_00353e2f:
            if (1 < (__int_type_conflict)
                    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)
            goto LAB_00353e36;
          }
          *pcVar4 = (char)((int)(ba->d).d.size << 3) - (char)puVar2;
          if (((ulong)puVar2 & 7) != 0) {
            pcVar4[((ulong)puVar2 >> 3) + 1] =
                 pcVar4[((ulong)puVar2 >> 3) + 1] & ~(-1 << (sbyte)((ulong)puVar2 & 7));
          }
          pDVar5 = (ba->d).d.d;
          qVar1 = (ba->d).d.size;
          if ((pDVar5 == (Data *)0x0) ||
             (1 < (__int_type_conflict)
                  (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
            QByteArray::reallocData(&ba->d,qVar1,KeepSize);
          }
          if ((ba->d).d.ptr[qVar1 + -1] == cVar6) goto LAB_00353eba;
          QByteArray::clear(&ba->d);
          goto LAB_00353ead;
        }
        if (0x7fffff < len) {
          len = 0x800000;
        }
        QByteArray::resize(&ba->d,len + lVar7 + 1);
        pDVar5 = (ba->d).d.d;
        if ((pDVar5 == (Data *)0x0) ||
           (1 < (__int_type_conflict)
                (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
          QByteArray::reallocData(&ba->d,(ba->d).d.size,KeepSize);
        }
        qVar3 = QDataStream::readRawData(in,(ba->d).d.ptr + lVar7 + 1,len);
        lVar7 = len + lVar7;
      } while (qVar3 == len);
      QByteArray::clear(&ba->d);
      status = ReadPastEnd;
    }
  }
  else {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(in,(qint64 *)&local_40);
    puVar2 = local_40;
    if (-1 < (long)local_40) goto LAB_00353d40;
    status = SizeLimitExceeded;
  }
  QDataStream::setStatus(in,status);
LAB_00353eba:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in;
}

Assistant:

QDataStream &operator>>(QDataStream &in, QBitArray &ba)
{
    ba.clear();
    qsizetype len;
    if (in.version() < QDataStream::Qt_6_0) {
        quint32 tmp;
        in >> tmp;
        if (Q_UNLIKELY(tmp > quint32((std::numeric_limits<qint32>::max)()))) {
            in.setStatus(QDataStream::ReadCorruptData);
            return in;
        }
        len = tmp;
    } else {
        quint64 tmp;
        in >> tmp;
        if (Q_UNLIKELY(tmp > quint64((std::numeric_limits<qsizetype>::max)()))) {
            in.setStatus(QDataStream::Status::SizeLimitExceeded);
            return in;
        }
        len = tmp;
    }
    if (len == 0) {
        ba.clear();
        return in;
    }

    const qsizetype Step = 8 * 1024 * 1024;
    const qsizetype totalBytes = storage_size(len);
    qsizetype allocated = 0;

    while (allocated < totalBytes) {
        qsizetype blockSize = qMin(Step, totalBytes - allocated);
        ba.d.resize(allocated + blockSize + 1);
        if (in.readRawData(ba.d.data() + 1 + allocated, blockSize) != blockSize) {
            ba.clear();
            in.setStatus(QDataStream::ReadPastEnd);
            return in;
        }
        allocated += blockSize;
    }

    const auto fromStream = ba.d.back();
    adjust_head_and_tail(ba.d.data(), ba.d.size(), len);
    if (ba.d.back() != fromStream) {
        ba.clear();
        in.setStatus(QDataStream::ReadCorruptData);
        return in;
    }
    return in;
}